

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O1

char * __thiscall QUndoModel::index(QUndoModel *this,char *__s,int __c)

{
  int iVar1;
  int in_ECX;
  int *in_R8;
  
  if (((*(long *)(__s + 0x10) != 0) &&
      (((*in_R8 < 0 || (in_R8[1] < 0)) || (*(long *)(in_R8 + 4) == 0)))) &&
     (((in_ECX == 0 && (-1 < __c)) && (iVar1 = QUndoStack::count(), __c <= iVar1)))) {
    *(int *)this = __c;
    *(undefined4 *)&this->field_0x4 = 0;
    *(undefined8 *)&this->field_0x8 = 0;
    this->m_stack = (QUndoStack *)__s;
    return (char *)this;
  }
  *(undefined8 *)this = 0xffffffffffffffff;
  *(undefined8 *)&this->field_0x8 = 0;
  this->m_stack = (QUndoStack *)0x0;
  return (char *)this;
}

Assistant:

QModelIndex QUndoModel::index(int row, int column, const QModelIndex &parent) const
{
    if (m_stack == nullptr)
        return QModelIndex();

    if (parent.isValid())
        return QModelIndex();

    if (column != 0)
        return QModelIndex();

    if (row < 0 || row > m_stack->count())
        return QModelIndex();

    return createIndex(row, column);
}